

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupCones(Gia_Man_t *p,int *pPos,int nPos,int fTrimPis)

{
  char *pcVar1;
  void *pvVar2;
  ulong *puVar3;
  int iVar4;
  Vec_Ptr_t *vLeaves;
  void **ppvVar5;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vRoots;
  int *piVar6;
  int *piVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  Gia_Obj_t *pGVar12;
  Gia_Obj_t *pGVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  
  vLeaves = (Vec_Ptr_t *)malloc(0x10);
  vLeaves->nCap = 100;
  vLeaves->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  vLeaves->pArray = ppvVar5;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  vNodes->pArray = ppvVar5;
  vRoots = (Vec_Ptr_t *)malloc(0x10);
  vRoots->nCap = 100;
  vRoots->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  vRoots->pArray = ppvVar5;
  uVar18 = (ulong)(uint)nPos;
  if (0 < nPos) {
    uVar19 = 0;
    do {
      uVar15 = pPos[uVar19];
      iVar4 = p->vCos->nSize;
      if (iVar4 - p->nRegs <= (int)uVar15) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (((int)uVar15 < 0) || (iVar4 <= (int)uVar15)) goto LAB_001eee49;
      iVar4 = p->vCos->pArray[uVar15];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_001eee2a;
      pGVar13 = p->pObjs;
      uVar15 = vRoots->nCap;
      if (vRoots->nSize == uVar15) {
        if ((int)uVar15 < 0x10) {
          if (vRoots->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vRoots->pArray,0x80);
          }
          iVar17 = 0x10;
        }
        else {
          iVar17 = uVar15 * 2;
          if (iVar17 <= (int)uVar15) goto LAB_001ee797;
          if (vRoots->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar15 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(vRoots->pArray,(ulong)uVar15 << 4);
          }
        }
        vRoots->pArray = ppvVar5;
        vRoots->nCap = iVar17;
      }
LAB_001ee797:
      iVar17 = vRoots->nSize;
      vRoots->nSize = iVar17 + 1;
      vRoots->pArray[iVar17] = pGVar13 + iVar4;
      uVar19 = uVar19 + 1;
    } while (uVar18 != uVar19);
  }
  Gia_ManIncrementTravId(p);
  if (p->nObjs < 1) {
LAB_001eedec:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->nTravIdsAlloc < 1) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x262,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  piVar6 = &vLeaves->nSize;
  *p->pTravIds = p->nTravIds;
  if (0 < vRoots->nSize) {
    lVar20 = 0;
    do {
      Gia_ManDupCones_rec(p,(Gia_Obj_t *)vRoots->pArray[lVar20],vLeaves,vNodes,vRoots);
      lVar20 = lVar20 + 1;
    } while (lVar20 < vRoots->nSize);
  }
  if (1 < (long)*piVar6) {
    qsort(vLeaves->pArray,(long)*piVar6,8,Gia_ObjCompareByCioId);
  }
  piVar7 = piVar6;
  if (fTrimPis == 0) {
    piVar7 = &p->vCis->nSize;
  }
  p_00 = Gia_ManStart(vRoots->nSize + *piVar7 + vNodes->nSize + 1);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar1);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar1);
  }
  p_00->pName = pcVar9;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar1);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar1);
  }
  p_00->pSpec = pcVar9;
  p->pObjs->Value = 0;
  if (fTrimPis == 0) {
    pVVar11 = p->vCis;
    uVar19 = (ulong)(uint)pVVar11->nSize;
    if (p->nRegs < pVVar11->nSize) {
      lVar20 = 0;
      do {
        if ((int)uVar19 <= lVar20) {
LAB_001eee49:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar4 = pVVar11->pArray[lVar20];
        if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_001eee2a:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar13 = p->pObjs;
        if (pGVar13 == (Gia_Obj_t *)0x0) break;
        pGVar12 = Gia_ManAppendObj(p_00);
        uVar19 = *(ulong *)pGVar12;
        *(ulong *)pGVar12 = uVar19 | 0x9fffffff;
        *(ulong *)pGVar12 =
             uVar19 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar10 = p_00->pObjs;
        if ((pGVar12 < pGVar10) || (pGVar10 + p_00->nObjs <= pGVar12)) goto LAB_001eedec;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar10) >> 2) * -0x55555555);
        pGVar10 = p_00->pObjs;
        if ((pGVar12 < pGVar10) || (pGVar10 + p_00->nObjs <= pGVar12)) goto LAB_001eedec;
        pGVar13[iVar4].Value = (int)((ulong)((long)pGVar12 - (long)pGVar10) >> 2) * 0x55555556;
        lVar20 = lVar20 + 1;
        pVVar11 = p->vCis;
        uVar19 = (ulong)pVVar11->nSize;
      } while (lVar20 < (long)(uVar19 - (long)p->nRegs));
    }
  }
  else if (0 < *piVar6) {
    lVar20 = 0;
    do {
      pvVar2 = vLeaves->pArray[lVar20];
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar19 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar19 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar19 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar13 = p_00->pObjs;
      if ((pGVar10 < pGVar13) || (pGVar13 + p_00->nObjs <= pGVar10)) goto LAB_001eedec;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar13) >> 2) * -0x55555555);
      pGVar13 = p_00->pObjs;
      if ((pGVar10 < pGVar13) || (pGVar13 + p_00->nObjs <= pGVar10)) goto LAB_001eedec;
      *(int *)((long)pvVar2 + 8) = (int)((ulong)((long)pGVar10 - (long)pGVar13) >> 2) * 0x55555556;
      lVar20 = lVar20 + 1;
    } while (lVar20 < *piVar6);
  }
  if (nPos < vRoots->nSize) {
    do {
      if (nPos < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pGVar13 = (Gia_Obj_t *)vRoots->pArray[uVar18];
      pGVar12 = Gia_ManAppendObj(p_00);
      uVar19 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar19 | 0x9fffffff;
      *(ulong *)pGVar12 =
           uVar19 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar10 = p_00->pObjs;
      if ((pGVar12 < pGVar10) || (pGVar10 + p_00->nObjs <= pGVar12)) goto LAB_001eedec;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar10) >> 2) * -0x55555555);
      pGVar10 = p_00->pObjs;
      if ((pGVar12 < pGVar10) || (pGVar10 + p_00->nObjs <= pGVar12)) goto LAB_001eedec;
      pGVar13 = Gia_ObjRiToRo(p,pGVar13);
      pGVar13->Value = (int)((ulong)((long)pGVar12 - (long)pGVar10) >> 2) * 0x55555556;
      uVar18 = uVar18 + 1;
    } while ((int)uVar18 < vRoots->nSize);
  }
  if (0 < vNodes->nSize) {
    lVar20 = 0;
    do {
      puVar3 = (ulong *)vNodes->pArray[lVar20];
      uVar18 = *puVar3;
      uVar19 = uVar18 & 0x1fffffff;
      uVar15 = (uint)(uVar18 >> 0x20);
      if ((uVar19 == 0x1fffffff || (int)(uint)uVar18 < 0) ||
         ((uVar15 & 0x1fffffff) <= ((uint)uVar18 & 0x1fffffff))) {
        uVar16 = *(uint *)((long)puVar3 + uVar19 * -0xc + 8);
        if (((int)uVar16 < 0) ||
           (uVar14 = *(uint *)((long)puVar3 + (ulong)(uVar15 & 0x1fffffff) * -0xc + 8),
           (int)uVar14 < 0)) goto LAB_001eee0b;
        iVar4 = Gia_ManAppendAnd(p_00,uVar16 ^ (uint)(uVar18 >> 0x1d) & 1,
                                 uVar14 ^ uVar15 >> 0x1d & 1);
      }
      else {
        uVar16 = *(uint *)((long)puVar3 + uVar19 * -0xc + 8);
        if (((int)uVar16 < 0) ||
           (uVar14 = *(uint *)((long)puVar3 + (ulong)(uVar15 & 0x1fffffff) * -0xc + 8),
           (int)uVar14 < 0)) goto LAB_001eee0b;
        uVar14 = uVar14 ^ uVar15 >> 0x1d & 1;
        iVar4 = Gia_ManAppendMux(p_00,uVar16 ^ (uint)(uVar18 >> 0x1d) & 1,uVar14 ^ 1,uVar14);
      }
      *(int *)(puVar3 + 1) = iVar4;
      lVar20 = lVar20 + 1;
    } while (lVar20 < vNodes->nSize);
  }
  iVar4 = vRoots->nSize;
  if (0 < iVar4) {
    lVar20 = 0;
    do {
      uVar16 = (uint)*vRoots->pArray[lVar20];
      uVar15 = *(uint *)((long)vRoots->pArray[lVar20] + (ulong)(uVar16 & 0x1fffffff) * -0xc + 8);
      if ((int)uVar15 < 0) {
LAB_001eee0b:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,uVar16 >> 0x1d & 1 ^ uVar15);
      lVar20 = lVar20 + 1;
      iVar4 = vRoots->nSize;
    } while (lVar20 < iVar4);
  }
  Gia_ManSetRegNum(p_00,iVar4 - nPos);
  if (vLeaves->pArray != (void **)0x0) {
    free(vLeaves->pArray);
    vLeaves->pArray = (void **)0x0;
  }
  free(vLeaves);
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
    vNodes->pArray = (void **)0x0;
  }
  free(vNodes);
  if (vRoots->pArray != (void **)0x0) {
    free(vRoots->pArray);
    vRoots->pArray = (void **)0x0;
  }
  free(vRoots);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupCones( Gia_Man_t * p, int * pPos, int nPos, int fTrimPis )
{
    Gia_Man_t * pNew;
    Vec_Ptr_t * vLeaves, * vNodes, * vRoots;
    Gia_Obj_t * pObj;
    int i;

    // collect initial POs
    vLeaves = Vec_PtrAlloc( 100 );
    vNodes = Vec_PtrAlloc( 100 );
    vRoots = Vec_PtrAlloc( 100 );
    for ( i = 0; i < nPos; i++ )
        Vec_PtrPush( vRoots, Gia_ManPo(p, pPos[i]) );

    // mark internal nodes
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
        Gia_ManDupCones_rec( p, pObj, vLeaves, vNodes, vRoots );
    Vec_PtrSort( vLeaves, (int (*)(void))Gia_ObjCompareByCioId );

    // start the new manager
//    Gia_ManFillValue( p );
    pNew = Gia_ManStart( (fTrimPis ? Vec_PtrSize(vLeaves) : Gia_ManCiNum(p)) + Vec_PtrSize(vNodes) + Vec_PtrSize(vRoots) + 1 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // map the constant node
    Gia_ManConst0(p)->Value = 0;
    // create PIs
    if ( fTrimPis )
    {
        Vec_PtrForEachEntry( Gia_Obj_t *, vLeaves, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    else
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    // create LOs
    Vec_PtrForEachEntryStart( Gia_Obj_t *, vRoots, pObj, i, nPos )
        Gia_ObjRiToRo(p, pObj)->Value = Gia_ManAppendCi( pNew );
    // create internal nodes
    Vec_PtrForEachEntry( Gia_Obj_t *, vNodes, pObj, i )
        if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManAppendXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create COs
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // finalize
    Gia_ManSetRegNum( pNew, Vec_PtrSize(vRoots)-nPos );
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_PtrFree( vRoots );
    return pNew;

}